

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool parse_view_box(element_t *element,int id,plutovg_rect_t *view_box)

{
  _Bool _Var1;
  attribute *paVar2;
  char *it_1;
  byte *pbVar3;
  undefined4 in_register_00000034;
  float *pfVar4;
  byte *end;
  bool bVar5;
  char *it;
  float h;
  float w;
  float y;
  float x;
  byte *local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  pfVar4 = (float *)CONCAT44(in_register_00000034,id);
  paVar2 = element->attributes;
  if (paVar2 == (attribute *)0x0) {
    return false;
  }
  while (paVar2->id != 0x27) {
    paVar2 = paVar2->next;
    if (paVar2 == (attribute *)0x0) {
      return false;
    }
  }
  local_28 = (byte *)(paVar2->value).data;
  end = local_28 + (paVar2->value).length;
  _Var1 = parse_float((char **)&local_28,(char *)end,&local_14);
  if (!_Var1) {
    return false;
  }
  if (local_28 < end) {
    if (0x2c < (ulong)*local_28) {
      return false;
    }
    if ((0x100100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0) {
      return false;
    }
    bVar5 = true;
    do {
      pbVar3 = local_28;
      if ((0x20 < (ulong)*local_28) || ((0x100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0))
      break;
      local_28 = local_28 + 1;
      bVar5 = local_28 < end;
      pbVar3 = end;
    } while (local_28 != end);
    local_28 = pbVar3;
    if ((((bVar5) && (pbVar3 < end)) && (*pbVar3 == 0x2c)) &&
       (pbVar3 = pbVar3 + 1, local_28 = pbVar3, pbVar3 < end)) {
      do {
        local_28 = pbVar3;
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        pbVar3 = pbVar3 + 1;
        local_28 = end;
      } while (pbVar3 != end);
    }
  }
  if ((local_28 < end) && (_Var1 = parse_float((char **)&local_28,(char *)end,&local_18), _Var1)) {
    if (local_28 < end) {
      if (0x2c < (ulong)*local_28) {
        return false;
      }
      if ((0x100100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0) {
        return false;
      }
      bVar5 = true;
      do {
        pbVar3 = local_28;
        if ((0x20 < (ulong)*local_28) || ((0x100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0))
        break;
        local_28 = local_28 + 1;
        bVar5 = local_28 < end;
        pbVar3 = end;
      } while (local_28 != end);
      local_28 = pbVar3;
      if ((((bVar5) && (pbVar3 < end)) && (*pbVar3 == 0x2c)) &&
         (pbVar3 = pbVar3 + 1, local_28 = pbVar3, pbVar3 < end)) {
        do {
          local_28 = pbVar3;
          if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
          break;
          pbVar3 = pbVar3 + 1;
          local_28 = end;
        } while (pbVar3 != end);
      }
    }
    if (((local_28 < end) && (_Var1 = parse_float((char **)&local_28,(char *)end,&local_1c), _Var1))
       && ((_Var1 = skip_ws_comma((char **)&local_28,(char *)end), _Var1 &&
           (_Var1 = parse_float((char **)&local_28,(char *)end,&local_20), _Var1)))) {
      if (local_28 < end) {
        bVar5 = true;
        do {
          if ((0x20 < (ulong)*local_28) || ((0x100002600U >> ((ulong)*local_28 & 0x3f) & 1) == 0))
          break;
          local_28 = local_28 + 1;
          bVar5 = local_28 < end;
        } while (local_28 != end);
        if (bVar5) {
          return false;
        }
      }
      if (local_1c <= 0.0) {
        return false;
      }
      if (0.0 < local_20) {
        *pfVar4 = local_14;
        pfVar4[1] = local_18;
        pfVar4[2] = local_1c;
        pfVar4[3] = local_20;
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

static bool parse_view_box(const element_t* element, int id, plutovg_rect_t* view_box)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;

    float x, y, w, h;
    if(!parse_float(&it, end, &x)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &y)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &w)
        || !skip_ws_comma(&it, end)
        || !parse_float(&it, end, &h)
        || skip_ws(&it, end)) {
        return false;
    }

    if(w <= 0.f || h <= 0.f)
        return false;
    view_box->x = x;
    view_box->y = y;
    view_box->w = w;
    view_box->h = h;
    return true;
}